

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void assign_adjust(LexState *ls,BCReg nvars,BCReg nexps,ExpDesc *e)

{
  BCReg from;
  FuncState *fs_00;
  BCReg n;
  int local_2c;
  BCReg reg;
  int32_t extra;
  FuncState *fs;
  ExpDesc *e_local;
  BCReg nexps_local;
  BCReg nvars_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  n = nvars - nexps;
  if (e->k == VCALL) {
    local_2c = n + 1;
    if (local_2c < 0) {
      local_2c = 0;
    }
    *(char *)((long)&fs_00->bcbase[(e->u).s.info].ins + 3) = (char)local_2c + '\x01';
    if (1 < local_2c) {
      bcreg_reserve(fs_00,local_2c - 1);
    }
  }
  else {
    if (e->k != VVOID) {
      expr_tonextreg(fs_00,e);
    }
    if (0 < (int)n) {
      from = fs_00->freereg;
      bcreg_reserve(fs_00,n);
      bcemit_nil(fs_00,from,n);
    }
  }
  if (nvars < nexps) {
    ls->fs->freereg = ls->fs->freereg - (nexps - nvars);
  }
  return;
}

Assistant:

static void assign_adjust(LexState *ls, BCReg nvars, BCReg nexps, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  int32_t extra = (int32_t)nvars - (int32_t)nexps;
  if (e->k == VCALL) {
    extra++;  /* Compensate for the VCALL itself. */
    if (extra < 0) extra = 0;
    setbc_b(bcptr(fs, e), extra+1);  /* Fixup call results. */
    if (extra > 1) bcreg_reserve(fs, (BCReg)extra-1);
  } else {
    if (e->k != VVOID)
      expr_tonextreg(fs, e);  /* Close last expression. */
    if (extra > 0) {  /* Leftover LHS are set to nil. */
      BCReg reg = fs->freereg;
      bcreg_reserve(fs, (BCReg)extra);
      bcemit_nil(fs, reg, (BCReg)extra);
    }
  }
  if (nexps > nvars)
    ls->fs->freereg -= nexps - nvars;  /* Drop leftover regs. */
}